

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O2

pair_type __thiscall booster::locale::gnu_gettext::mo_file::value(mo_file *this,int id)

{
  uint32_t uVar1;
  uint32_t uVar2;
  runtime_error *this_00;
  pair_type pVar3;
  allocator local_39;
  string local_38;
  
  uVar1 = get(this,id * 8 + this->translations_offset_);
  uVar2 = get(this,this->translations_offset_ + id * 8 + 4);
  if (((ulong)uVar2 < this->file_size_) && ((ulong)(uVar2 + uVar1) < this->file_size_)) {
    pVar3.first = this->data_ + uVar2;
    pVar3.second = pVar3.first + uVar1;
    return pVar3;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_38,"Bad mo-file format",&local_39);
  runtime_error::runtime_error(this_00,&local_38);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

pair_type value(int id) const
                {
                    uint32_t len = get(translations_offset_ + id*8);
                    uint32_t off = get(translations_offset_ + id*8 + 4);
                    if(off >= file_size_ || off + len >= file_size_)
                        throw booster::runtime_error("Bad mo-file format");
                    return pair_type(&data_[off],&data_[off]+len);
                }